

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

_Bool upb_MiniTable_Link(upb_MiniTable *m,upb_MiniTable **sub_tables,size_t sub_table_count,
                        upb_MiniTableEnum **sub_enums,size_t sub_enum_count)

{
  _Bool _Var1;
  int iVar2;
  upb_CType uVar3;
  upb_MiniTableField *puVar4;
  ulong uVar5;
  uint uVar6;
  bool local_79;
  upb_MiniTableEnum *sub_1;
  upb_MiniTableField *f_1;
  int i_1;
  upb_MiniTable *sub;
  upb_MiniTableField *f;
  uint local_40;
  int i;
  uint32_t enum_count;
  uint32_t msg_count;
  size_t sub_enum_count_local;
  upb_MiniTableEnum **sub_enums_local;
  size_t sub_table_count_local;
  upb_MiniTable **sub_tables_local;
  upb_MiniTable *m_local;
  
  i = 0;
  local_40 = 0;
  for (f._4_4_ = 0; iVar2 = upb_MiniTable_FieldCount(m), (int)f._4_4_ < iVar2; f._4_4_ = f._4_4_ + 1
      ) {
    puVar4 = upb_MiniTable_GetFieldByIndex(m,f._4_4_);
    uVar3 = upb_MiniTableField_CType(puVar4);
    if (uVar3 == kUpb_CType_Message) {
      uVar6 = i + 1;
      uVar5 = (ulong)(uint)i;
      if (sub_table_count < uVar6) {
        return false;
      }
      i = uVar6;
      if ((sub_tables[uVar5] != (upb_MiniTable *)0x0) &&
         (_Var1 = upb_MiniTable_SetSubMessage(m,puVar4,sub_tables[uVar5]), !_Var1)) {
        return false;
      }
    }
  }
  f_1._4_4_ = 0;
  do {
    iVar2 = upb_MiniTable_FieldCount(m);
    if (iVar2 <= (int)f_1._4_4_) {
      local_79 = (uint)i == sub_table_count && local_40 == sub_enum_count;
      return local_79;
    }
    puVar4 = upb_MiniTable_GetFieldByIndex(m,f_1._4_4_);
    _Var1 = upb_MiniTableField_IsClosedEnum(puVar4);
    if (_Var1) {
      uVar6 = local_40 + 1;
      uVar5 = (ulong)local_40;
      if (sub_enum_count < uVar6) {
        return false;
      }
      local_40 = uVar6;
      if ((sub_enums[uVar5] != (upb_MiniTableEnum *)0x0) &&
         (_Var1 = upb_MiniTable_SetSubEnum(m,puVar4,sub_enums[uVar5]), !_Var1)) {
        return false;
      }
    }
    f_1._4_4_ = f_1._4_4_ + 1;
  } while( true );
}

Assistant:

bool upb_MiniTable_Link(upb_MiniTable* m, const upb_MiniTable** sub_tables,
                        size_t sub_table_count,
                        const upb_MiniTableEnum** sub_enums,
                        size_t sub_enum_count) {
  uint32_t msg_count = 0;
  uint32_t enum_count = 0;

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    upb_MiniTableField* f =
        (upb_MiniTableField*)upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_CType(f) == kUpb_CType_Message) {
      const upb_MiniTable* sub = sub_tables[msg_count++];
      if (msg_count > sub_table_count) return false;
      if (sub && !upb_MiniTable_SetSubMessage(m, f, sub)) return false;
    }
  }

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    upb_MiniTableField* f =
        (upb_MiniTableField*)upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_IsClosedEnum(f)) {
      const upb_MiniTableEnum* sub = sub_enums[enum_count++];
      if (enum_count > sub_enum_count) return false;
      if (sub && !upb_MiniTable_SetSubEnum(m, f, sub)) return false;
    }
  }

  return (msg_count == sub_table_count) && (enum_count == sub_enum_count);
}